

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeKernelCreate
          (ze_module_handle_t hModule,ze_kernel_desc_t *desc,ze_kernel_handle_t *phKernel)

{
  object_t<_ze_kernel_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnKernelCreate_t pfnCreate;
  dditable_t *dditable;
  ze_kernel_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_kernel_handle_t *phKernel_local;
  ze_kernel_desc_t *desc_local;
  ze_module_handle_t hModule_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(ze_pfnKernelCreate_t *)(hModule + 8);
  if (*(code **)(pfnCreate + 0x550) == (code *)0x0) {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    desc_local = *(ze_kernel_desc_t **)hModule;
    pp_Stack_28 = phKernel;
    phKernel_local = (ze_kernel_handle_t *)desc;
    dditable._4_4_ = (**(code **)(pfnCreate + 0x550))(desc_local,desc,phKernel);
    hModule_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_kernel_handle_t*>,_ze_kernel_handle_t*>::
               getInstance<_ze_kernel_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_kernel_handle_t*>,_ze_kernel_handle_t*>
                           *)(context + 0x480),pp_Stack_28,(dditable_t **)&pfnCreate);
      *pp_Stack_28 = (ze_kernel_handle_t)poVar1;
      hModule_local._4_4_ = dditable._4_4_;
    }
  }
  return hModule_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelCreate(
        ze_module_handle_t hModule,                     ///< [in] handle of the module
        const ze_kernel_desc_t* desc,                   ///< [in] pointer to kernel descriptor
        ze_kernel_handle_t* phKernel                    ///< [out] handle of the Function object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( hModule )->dditable;
        auto pfnCreate = dditable->ze.Kernel.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModule = reinterpret_cast<ze_module_object_t*>( hModule )->handle;

        // forward to device-driver
        result = pfnCreate( hModule, desc, phKernel );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phKernel = reinterpret_cast<ze_kernel_handle_t>(
                context->ze_kernel_factory.getInstance( *phKernel, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }